

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O0

path * __thiscall
libtest::unit_test<libtest::a_plus_b>::small_genfile_path_abi_cxx11_
          (path *__return_storage_ptr__,unit_test<libtest::a_plus_b> *this,usize index,bool in)

{
  bool bVar1;
  allocator<char> local_12b;
  byte local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  path local_70;
  path local_48;
  byte local_19;
  unit_test<libtest::a_plus_b> *puStack_18;
  bool in_local;
  usize index_local;
  
  local_19 = (byte)index & 1;
  puStack_18 = this;
  index_local = (usize)__return_storage_ptr__;
  gen_case_dir_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"small_",&local_d1);
  std::__cxx11::to_string(&local_108,(unsigned_long)puStack_18);
  std::operator+(&local_b0,&local_d0,&local_108);
  local_12a = 0;
  bVar1 = (local_19 & 1) == 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,".out",&local_12b);
  }
  else {
    std::allocator<char>::allocator();
    local_12a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,".in",&local_129);
  }
  std::operator+(&local_90,&local_b0,&local_128);
  std::filesystem::__cxx11::path::path(&local_70,&local_90,auto_format);
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,&local_48,&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_128);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_12b);
  }
  if ((local_12a & 1) != 0) {
    std::allocator<char>::~allocator(&local_129);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::filesystem::__cxx11::path::~path(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static fs::path small_genfile_path(const usize index, const bool in) { return gen_case_dir() / (std::string("small_") + std::to_string(index) + (in ? std::string(".in") : std::string(".out"))); }